

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O1

_Bool borg_obj_has_effect(uint32_t kind,wchar_t index,wchar_t subtype)

{
  effect *peVar1;
  
  for (peVar1 = k_info[kind].effect;
      (peVar1 != (effect *)0x0 &&
      (((uint)peVar1->index != index || ((subtype != L'\xffffffff' && (peVar1->subtype != subtype)))
       ))); peVar1 = peVar1->next) {
  }
  return peVar1 != (effect *)0x0;
}

Assistant:

bool borg_obj_has_effect(uint32_t kind, int index, int subtype)
{
    struct effect* ke = k_info[kind].effect;
    while (ke) {
        if (ke->index == index && (ke->subtype == subtype || subtype == -1))
            return true;
        ke = ke->next;
    }
    return false;
}